

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

DoubleRange * __thiscall CoreML::Specification::DoubleRange::New(DoubleRange *this,Arena *arena)

{
  DoubleRange *this_00;
  
  this_00 = (DoubleRange *)operator_new(0x28);
  DoubleRange(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::DoubleRange>(arena,this_00);
  }
  return this_00;
}

Assistant:

DoubleRange* DoubleRange::New(::google::protobuf::Arena* arena) const {
  DoubleRange* n = new DoubleRange;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}